

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.h
# Opt level: O0

bool FileUtil::readDataLocally
               (string *data_path,vector<Rating,_std::allocator<Rating>_> *ratings,int min_row_index
               ,int max_row_index,int total_rating_num,int row_num)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  byte bVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  long *plVar8;
  int *piVar9;
  reference pvVar10;
  int in_ECX;
  int in_EDX;
  vector<Rating,_std::allocator<Rating>_> *in_RSI;
  string *in_RDI;
  int in_R8D;
  int in_R9D;
  int offset;
  int row_index;
  bool finish;
  int rating_num;
  int global_id_start;
  int index;
  int *col_indices;
  longlong size3;
  int *row_nums;
  longlong size2;
  double *score_ptr;
  int *score_rows;
  longlong size;
  longlong begin_skip;
  ifstream data_file;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  vector<Rating,_std::allocator<Rating>_> *in_stack_fffffffffffffc80;
  value_type_conflict1 vVar11;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  byte local_295;
  int local_294;
  int local_290;
  int local_28c;
  void *local_288;
  ulong local_280;
  void *local_278;
  ulong local_270;
  void *local_268;
  undefined4 local_25c;
  void *local_258;
  ulong local_250;
  long local_248;
  char local_230 [520];
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  vector<Rating,_std::allocator<Rating>_> *local_18;
  byte local_1;
  
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  std::ifstream::ifstream(local_230,in_RDI,_S_in);
  bVar4 = std::ios::good();
  if ((bVar4 & 1) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"cannot open ");
    poVar6 = std::operator<<(poVar6,in_RDI);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  local_248 = (long)(local_1c << 3);
  std::istream::seekg((long)local_230,local_1c << 3);
  local_250 = (ulong)((local_20 - local_1c) * 8);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_250;
  uVar7 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  local_258 = operator_new__(uVar7);
  plVar8 = (long *)std::istream::read(local_230,(long)local_258);
  bVar4 = std::ios::operator!((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
  if ((bVar4 & 1) == 0) {
    local_268 = local_258;
    local_248 = (long)(local_24 << 3);
    std::istream::seekg((long)local_230,local_24 << 3);
    local_270 = (ulong)(local_28 * 4 + 4);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_270;
    uVar7 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    local_278 = operator_new__(uVar7);
    plVar8 = (long *)std::istream::read(local_230,(long)local_278);
    bVar4 = std::ios::operator!((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
    if ((bVar4 & 1) == 0) {
      local_248 = (long)(local_1c << 2);
      std::istream::seekg((long)local_230,local_1c << 2);
      local_280 = (ulong)((local_20 - local_1c) * 4);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_280;
      uVar7 = SUB168(auVar3 * ZEXT816(4),0);
      if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      local_288 = operator_new__(uVar7);
      plVar8 = (long *)std::istream::read(local_230,(long)local_288);
      bVar4 = std::ios::operator!((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
      if ((bVar4 & 1) == 0) {
        std::vector<Rating,_std::allocator<Rating>_>::resize
                  (in_stack_fffffffffffffc80,
                   CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        local_28c = 0;
        local_290 = 0;
        local_294 = 0;
        local_295 = 0;
        for (local_29c = 1; local_29c < local_28 + 1; local_29c = local_29c + 1) {
          if (local_1c <= *(int *)((long)local_278 + (long)local_29c * 4)) {
            if ((*(int *)((long)local_278 + (long)(local_29c + -1) * 4) < local_1c) &&
               (local_1c <= *(int *)((long)local_278 + (long)local_29c * 4))) {
              local_290 = local_1c;
              local_2a0 = local_20 - *(int *)((long)local_278 + (long)(local_29c + -1) * 4);
              local_2a4 = *(int *)((long)local_278 + (long)local_29c * 4) -
                          *(int *)((long)local_278 + (long)(local_29c + -1) * 4);
              piVar9 = std::min<int>(&local_2a0,&local_2a4);
              local_294 = *piVar9;
            }
            else {
              if ((*(int *)((long)local_278 + (long)(local_29c + -1) * 4) < local_1c) ||
                 (local_20 <= *(int *)((long)local_278 + (long)(local_29c + -1) * 4))) {
                poVar6 = std::operator<<((ostream *)&std::cerr,"Logical error!");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                local_1 = 0;
                goto LAB_0016f791;
              }
              local_290 = *(int *)((long)local_278 + (long)(local_29c + -1) * 4);
              local_2a8 = local_20 - *(int *)((long)local_278 + (long)(local_29c + -1) * 4);
              local_2ac = *(int *)((long)local_278 + (long)local_29c * 4) -
                          *(int *)((long)local_278 + (long)(local_29c + -1) * 4);
              piVar9 = std::min<int>(&local_2a8,&local_2ac);
              local_294 = *piVar9;
            }
            for (local_2b0 = 0; local_2b0 < local_294; local_2b0 = local_2b0 + 1) {
              iVar5 = local_290 + local_2b0;
              pvVar10 = std::vector<Rating,_std::allocator<Rating>_>::operator[]
                                  (local_18,(long)local_28c);
              pvVar10->global_id = iVar5;
              iVar5 = local_29c + -1;
              pvVar10 = std::vector<Rating,_std::allocator<Rating>_>::operator[]
                                  (local_18,(long)local_28c);
              pvVar10->user_id = iVar5;
              iVar5 = *(int *)((long)local_288 + (long)local_28c * 4);
              pvVar10 = std::vector<Rating,_std::allocator<Rating>_>::operator[]
                                  (local_18,(long)local_28c);
              pvVar10->item_id = iVar5;
              vVar11 = *(value_type_conflict1 *)((long)local_268 + (long)local_28c * 8);
              pvVar10 = std::vector<Rating,_std::allocator<Rating>_>::operator[]
                                  (local_18,(long)local_28c);
              pvVar10->score = vVar11;
              local_28c = local_28c + 1;
              if (local_20 - local_1c <= local_28c) {
                local_295 = 1;
                break;
              }
            }
            if ((local_295 & 1) != 0) break;
          }
        }
        std::ifstream::close();
        if (local_258 != (void *)0x0) {
          operator_delete__(local_258);
        }
        if (local_278 != (void *)0x0) {
          operator_delete__(local_278);
        }
        if (local_288 != (void *)0x0) {
          operator_delete__(local_288);
        }
        local_1 = 1;
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error in reading col index from file!");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        if (local_258 != (void *)0x0) {
          operator_delete__(local_258);
        }
        if (local_278 != (void *)0x0) {
          operator_delete__(local_278);
        }
        if (local_288 != (void *)0x0) {
          operator_delete__(local_288);
        }
        local_1 = 0;
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Error in reading row index from file!");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      if (local_258 != (void *)0x0) {
        operator_delete__(local_258);
      }
      if (local_278 != (void *)0x0) {
        operator_delete__(local_278);
      }
      local_1 = 0;
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in reading rating values from file!");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    if (local_258 != (void *)0x0) {
      operator_delete__(local_258);
    }
    local_1 = 0;
  }
LAB_0016f791:
  local_25c = 1;
  std::ifstream::~ifstream(local_230);
  return (bool)(local_1 & 1);
}

Assistant:

bool readDataLocally(string data_path, vector<Rating> &ratings, const int min_row_index,
                         const int max_row_index, const int total_rating_num, const int row_num) {
        ifstream data_file(data_path);
        if(!data_file.good()){
            cerr << "cannot open " << data_path << endl;
            exit(1);
        }

        long long begin_skip = min_row_index * size_of_double;

        // scores
        data_file.seekg(begin_skip, std::ios_base::cur);

        long long size = (max_row_index - min_row_index) * size_of_double;
        int *score_rows = new int[size];
        if (!data_file.read(reinterpret_cast<char *>(score_rows), size)) {
            cerr << "Error in reading rating values from file!" << endl;
            delete[] score_rows;
            return false;
        }

        double *score_ptr = reinterpret_cast<double *>(score_rows);

        // row_index
        begin_skip = total_rating_num * size_of_double;
        data_file.seekg(begin_skip, std::ios_base::beg);
        long long size2 = size_of_int * (row_num + 1);
        int *row_nums = new int[size2];
        if (!data_file.read(reinterpret_cast<char *>(row_nums), size2)) {
            cerr << "Error in reading row index from file!" << endl;
            delete[] score_rows;
            delete[] row_nums;
            return false;
        }

        // col_index
        begin_skip = min_row_index * size_of_int;
        data_file.seekg(begin_skip, std::ios_base::cur);

        long long size3 = size_of_int * (max_row_index - min_row_index);

        int *col_indices = new int[size3];
        if (!data_file.read(reinterpret_cast<char *>(col_indices), size3)) {
            cerr << "Error in reading col index from file!" << endl;
            delete[] score_rows;
            delete[] row_nums;
            delete[] col_indices;
            return false;
        }

        // format data
        ratings.resize(max_row_index - min_row_index);
        int index = 0;
        int global_id_start = 0;
        int rating_num = 0;
        bool finish = false;
        for (int row_index = 1; row_index < row_num + 1; row_index++) {

            // accumulation includes row of row_index = row_nums[row_index];
            if (row_nums[row_index] < min_row_index) {
                continue;
            } else if (row_nums[row_index - 1] < min_row_index && row_nums[row_index] >= min_row_index) {
                global_id_start = min_row_index;
                rating_num = std::min(max_row_index - row_nums[row_index - 1],
                                      row_nums[row_index] - row_nums[row_index - 1]);
            } else if (row_nums[row_index - 1] >= min_row_index && row_nums[row_index - 1] < max_row_index) {
                global_id_start = row_nums[row_index - 1];
                rating_num = std::min(max_row_index - row_nums[row_index - 1],
                                      row_nums[row_index] - row_nums[row_index - 1]);
            } else {
                cerr << "Logical error!" << endl;
                return false;
            }

            for (int offset = 0; offset < rating_num; offset++) {
                ratings[index].global_id = global_id_start + offset;
                ratings[index].user_id = row_index - 1;
                ratings[index].item_id = col_indices[index];
                ratings[index].score = score_ptr[index];

                index++;
                if (index >= max_row_index - min_row_index) {
                    finish = true;
                    break;
                }
            }

            if (finish) {
                break;
            }
        }

        data_file.close();

        delete[] score_rows;
        delete[] row_nums;
        delete[] col_indices;

        return true;
    }